

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O0

base_learner * cs_active_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  _func_void_shared_data_ptr_float *p_Var2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  undefined *puVar9;
  byte bVar10;
  bool bVar11;
  pointer pcVar12;
  undefined8 uVar13;
  ostream *this;
  learner<cs_active,_example> *this_00;
  id in_RSI;
  long *in_RDI;
  base_learner *b;
  learner<cs_active,_example> *l;
  uint32_t i;
  stringstream __msg_4;
  stringstream __msg_3;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  string loss_function_type;
  option_group_definition new_options;
  int domination;
  bool simulation;
  free_ptr<cs_active> data;
  typed_option<float> *in_stack_ffffffffffffe168;
  prediction_type_t pVar14;
  vw *in_stack_ffffffffffffe170;
  string *in_stack_ffffffffffffe178;
  typed_option<float> *in_stack_ffffffffffffe180;
  string *in_stack_ffffffffffffe188;
  free_ptr<cs_active> *in_stack_ffffffffffffe190;
  int iVar15;
  learner<cs_active,_example> *this_01;
  char *in_stack_ffffffffffffe198;
  vw_exception *in_stack_ffffffffffffe1a0;
  undefined4 in_stack_ffffffffffffe1b8;
  undefined4 in_stack_ffffffffffffe1bc;
  uint uVar16;
  option_group_definition *in_stack_ffffffffffffe1c0;
  shared_data *psVar17;
  allocator *l_00;
  uint local_1b78;
  allocator local_1b71;
  string local_1b70 [39];
  undefined1 local_1b49;
  stringstream local_1b28 [16];
  ostream local_1b18;
  allocator local_1999;
  string local_1998 [39];
  undefined1 local_1971;
  stringstream local_1950 [16];
  ostream local_1940;
  allocator local_17c1;
  string local_17c0 [39];
  undefined1 local_1799;
  stringstream local_1778 [16];
  ostream local_1768;
  allocator local_15e9;
  string local_15e8 [39];
  undefined1 local_15c1;
  stringstream local_15a0 [16];
  ostream local_1590;
  allocator local_1411;
  string local_1410 [39];
  undefined1 local_13e9;
  stringstream local_13c8 [16];
  ostream local_13b8;
  string local_1240 [32];
  undefined4 local_1220;
  allocator local_1219;
  string local_1218 [39];
  allocator local_11f1;
  string local_11f0 [39];
  allocator local_11c9;
  string local_11c8 [39];
  allocator local_11a1;
  string local_11a0 [359];
  allocator local_1039;
  string local_1038 [39];
  allocator local_1011;
  string local_1010 [359];
  allocator local_ea9;
  string local_ea8 [39];
  allocator local_e81;
  string local_e80 [359];
  allocator local_d19;
  string local_d18 [39];
  allocator local_cf1;
  string local_cf0 [359];
  allocator local_b89;
  string local_b88 [39];
  allocator local_b61;
  string local_b60 [359];
  allocator local_9f9;
  string local_9f8 [39];
  allocator local_9d1;
  string local_9d0 [359];
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [359];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [359];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [359];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [359];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<unsigned_int> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [56];
  int local_30;
  byte local_29;
  undefined1 local_28 [32];
  AllReduce *local_8;
  
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<cs_active>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Cost-sensitive Active Learning",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe170,
             (string *)in_stack_ffffffffffffe168);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"cs_active",&local_201);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2ba720);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe178,(uint *)in_stack_ffffffffffffe170)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"Cost-sensitive active learning with <k> costs",&local_229)
  ;
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe170,
             (string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe170,
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_ffffffffffffe1c0,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"simulation",&local_391);
  VW::config::make_option<bool>(in_stack_ffffffffffffe178,(bool *)in_stack_ffffffffffffe170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b8,"cost-sensitive active learning simulation mode",&local_3b9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffe170,
             (typed_option<bool> *)in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe1c0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"baseline",&local_521);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2ba8fc);
  VW::config::make_option<bool>(in_stack_ffffffffffffe178,(bool *)in_stack_ffffffffffffe170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"cost-sensitive active learning baseline",&local_549);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffe170,
             (typed_option<bool> *)in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe1c0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"domination",&local_6b1);
  VW::config::make_option<int>(in_stack_ffffffffffffe178,(int *)in_stack_ffffffffffffe170);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_ffffffffffffe180,
             (int)((ulong)in_stack_ffffffffffffe178 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6d8,"cost-sensitive active learning use domination. Default 1",&local_6d9);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_ffffffffffffe170,
             (typed_option<int> *)in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<int>
            (in_stack_ffffffffffffe1c0,
             (typed_option<int> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"mellowness",&local_841);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2baad8);
  VW::config::make_option<float>(in_stack_ffffffffffffe178,(float *)in_stack_ffffffffffffe170);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe180,(float)((ulong)in_stack_ffffffffffffe178 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"mellowness parameter c_0. Default 0.1.",&local_869);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe1c0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d0,"range_c",&local_9d1);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2babd9);
  VW::config::make_option<float>(in_stack_ffffffffffffe178,(float *)in_stack_ffffffffffffe170);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe180,(float)((ulong)in_stack_ffffffffffffe178 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9f8,
             "parameter controlling the threshold for per-label cost uncertainty. Default 0.5.",
             &local_9f9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe1c0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b60,"max_labels",&local_b61);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bacde);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe178,(unsigned_long *)in_stack_ffffffffffffe170);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe180,
             (unsigned_long)in_stack_ffffffffffffe178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"maximum number of label queries.",&local_b89);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170,
             (string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe1c0,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf0,"min_labels",&local_cf1);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bade2);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe178,(unsigned_long *)in_stack_ffffffffffffe170);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe180,
             (unsigned_long)in_stack_ffffffffffffe178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d18,"minimum number of label queries.",&local_d19);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170,
             (string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe1c0,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  l_00 = &local_e81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e80,"cost_max",l_00);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2baee6);
  VW::config::make_option<float>(in_stack_ffffffffffffe178,(float *)in_stack_ffffffffffffe170);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe180,(float)((ulong)in_stack_ffffffffffffe178 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea8,"cost upper bound. Default 1.",&local_ea9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe1c0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1010,"cost_min",&local_1011);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bafeb);
  VW::config::make_option<float>(in_stack_ffffffffffffe178,(float *)in_stack_ffffffffffffe170);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe180,(float)((ulong)in_stack_ffffffffffffe178 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1038,"cost lower bound. Default 0.",&local_1039);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe1c0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11a0,"csa_debug",&local_11a1);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bb0eb);
  VW::config::make_option<bool>(in_stack_ffffffffffffe178,(bool *)in_stack_ffffffffffffe170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c8,"print debug stuff for cs_active",&local_11c9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe170,(string *)in_stack_ffffffffffffe168);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffe170,
             (typed_option<bool> *)in_stack_ffffffffffffe168);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe1c0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b8));
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_11c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_11a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator((allocator<char> *)&local_1011);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_ea8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_e80);
  std::allocator<char>::~allocator((allocator<char> *)&local_e81);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe170);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_68);
  pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                      ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bb50a);
  uVar13 = local_28._24_8_;
  pcVar12->use_domination = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11f0,"domination",&local_11f1);
  bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_11f0);
  std::__cxx11::string::~string(local_11f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
  if ((bVar10 & 1) != 0 && local_30 == 0) {
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bb5e3);
    pcVar12->use_domination = false;
  }
  uVar13 = local_28._24_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1218,"cs_active",&local_1219);
  bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_1218);
  std::__cxx11::string::~string(local_1218);
  std::allocator<char>::~allocator((allocator<char> *)&local_1219);
  uVar13 = local_28._16_8_;
  if (((bVar10 ^ 0xff) & 1) == 0) {
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bc135);
    pcVar12->all = (vw *)uVar13;
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bc14e);
    pcVar12->t = 1;
    (**(*(loss_function **)(local_28._16_8_ + 0x3548))->_vptr_loss_function)(local_1240);
    bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe170,(char *)in_stack_ffffffffffffe168);
    uVar13 = local_28._24_8_;
    if (bVar11) {
      std::__cxx11::stringstream::stringstream(local_13c8);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe190 >> 0x20);
      std::operator<<(&local_13b8,"error: you can\'t use non-squared loss with cs_active");
      local_13e9 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198,iVar15,
                 in_stack_ffffffffffffe188);
      local_13e9 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1410,"lda",&local_1411);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_1410);
    std::__cxx11::string::~string(local_1410);
    std::allocator<char>::~allocator((allocator<char> *)&local_1411);
    uVar13 = local_28._24_8_;
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_15a0);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe190 >> 0x20);
      std::operator<<(&local_1590,"error: you can\'t combine lda and active learning");
      local_15c1 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198,iVar15,
                 in_stack_ffffffffffffe188);
      local_15c1 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_15e8,"active",&local_15e9);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_15e8);
    std::__cxx11::string::~string(local_15e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_15e9);
    uVar13 = local_28._24_8_;
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1778);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe190 >> 0x20);
      std::operator<<(&local_1768,"error: you can\'t use --cs_active and --active at the same time")
      ;
      local_1799 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198,iVar15,
                 in_stack_ffffffffffffe188);
      local_1799 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17c0,"active_cover",&local_17c1);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_17c0);
    std::__cxx11::string::~string(local_17c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_17c1);
    uVar13 = local_28._24_8_;
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1950);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe190 >> 0x20);
      std::operator<<(&local_1940,
                      "error: you can\'t use --cs_active and --active_cover at the same time");
      local_1971 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198,iVar15,
                 in_stack_ffffffffffffe188);
      local_1971 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1998,"csoaa",&local_1999);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_1998);
    std::__cxx11::string::~string(local_1998);
    std::allocator<char>::~allocator((allocator<char> *)&local_1999);
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1b28);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe190 >> 0x20);
      std::operator<<(&local_1b18,"error: you can\'t use --cs_active and --csoaa at the same time");
      local_1b49 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198,iVar15,
                 in_stack_ffffffffffffe188);
      local_1b49 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b70,"adax",&local_1b71);
    bVar10 = (**(code **)(*(long *)local_28._24_8_ + 8))(local_28._24_8_,local_1b70);
    std::__cxx11::string::~string(local_1b70);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b71);
    if (((bVar10 ^ 0xff) & 1) != 0) {
      this = std::operator<<((ostream *)(local_28._16_8_ + 0xe0),
                             "WARNING: --cs_active should be used with --adax");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    ppVar1 = *(parser **)(local_28._16_8_ + 8);
    (ppVar1->lp).label_size = DAT_00486d58;
    puVar9 = PTR_test_label_00486d50;
    puVar8 = PTR_weight_00486d40;
    puVar7 = PTR_delete_label_00486d38;
    puVar6 = PTR_read_cached_label_00486d30;
    puVar5 = PTR_cache_label_00486d28;
    puVar4 = PTR_parse_label_00486d20;
    puVar3 = COST_SENSITIVE::cs_label;
    (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_00486d48;
    (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar9;
    (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar7;
    (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar8;
    (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar5;
    (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar6;
    (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar3;
    (ppVar1->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar4;
    psVar17 = *(shared_data **)local_28._16_8_;
    p_Var2 = *(_func_void_shared_data_ptr_float **)(local_28._16_8_ + 0x40);
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bcc32);
    (*p_Var2)(psVar17,pcVar12->cost_max);
    psVar17 = *(shared_data **)local_28._16_8_;
    p_Var2 = *(_func_void_shared_data_ptr_float **)(local_28._16_8_ + 0x40);
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bcc6e);
    (*p_Var2)(psVar17,pcVar12->cost_min);
    local_1b78 = 0;
    while (uVar16 = local_1b78,
          pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                              ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bcca7),
          uVar16 < pcVar12->num_classes + 1) {
      std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bccc5);
      v_array<unsigned_long>::push_back
                ((v_array<unsigned_long> *)in_stack_ffffffffffffe170,
                 (unsigned_long *)in_stack_ffffffffffffe168);
      local_1b78 = local_1b78 + 1;
    }
    if ((local_29 & 1) == 0) {
      in_stack_ffffffffffffe188 =
           (string *)setup_base((options_i *)in_stack_ffffffffffffe178,in_stack_ffffffffffffe170);
      pVar14 = (prediction_type_t)((ulong)in_stack_ffffffffffffe168 >> 0x20);
      in_stack_ffffffffffffe180 =
           (typed_option<float> *)LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      in_stack_ffffffffffffe170 = (vw *)local_28;
      std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bcdc0);
      this_00 = LEARNER::init_learner<cs_active,example,LEARNER::learner<char,example>>
                          (in_stack_ffffffffffffe190,
                           (learner<char,_example> *)in_stack_ffffffffffffe188,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe180,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe178,(size_t)in_stack_ffffffffffffe170,pVar14);
    }
    else {
      setup_base((options_i *)in_stack_ffffffffffffe178,in_stack_ffffffffffffe170);
      pVar14 = (prediction_type_t)((ulong)in_stack_ffffffffffffe168 >> 0x20);
      LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2bcd45);
      this_00 = LEARNER::init_learner<cs_active,example,LEARNER::learner<char,example>>
                          (in_stack_ffffffffffffe190,
                           (learner<char,_example> *)in_stack_ffffffffffffe188,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe180,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe178,(size_t)in_stack_ffffffffffffe170,pVar14);
    }
    this_01 = this_00;
    LEARNER::learner<cs_active,_example>::set_finish_example(this_00,finish_example);
    LEARNER::learner<cs_active,_example>::set_finish
              (this_01,(_func_void_cs_active_ptr *)in_stack_ffffffffffffe188);
    local_8 = (AllReduce *)LEARNER::make_base<cs_active,example>(this_00);
    *(AllReduce **)(local_28._16_8_ + 0x38) = local_8;
    local_1220 = 1;
    std::__cxx11::string::~string(local_1240);
  }
  else {
    local_8 = (AllReduce *)0x0;
    local_1220 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe170);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)in_stack_ffffffffffffe180);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cs_active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cs_active>();

  bool simulation = false;
  int domination;
  option_group_definition new_options("Cost-sensitive Active Learning");
  new_options
      .add(make_option("cs_active", data->num_classes).keep().help("Cost-sensitive active learning with <k> costs"))
      .add(make_option("simulation", simulation).help("cost-sensitive active learning simulation mode"))
      .add(make_option("baseline", data->is_baseline).help("cost-sensitive active learning baseline"))
      .add(make_option("domination", domination)
               .default_value(1)
               .help("cost-sensitive active learning use domination. Default 1"))
      .add(make_option("mellowness", data->c0).default_value(0.1f).help("mellowness parameter c_0. Default 0.1."))
      .add(make_option("range_c", data->c1)
               .default_value(0.5f)
               .help("parameter controlling the threshold for per-label cost uncertainty. Default 0.5."))
      .add(make_option("max_labels", data->max_labels).default_value(-1).help("maximum number of label queries."))
      .add(make_option("min_labels", data->min_labels).default_value(-1).help("minimum number of label queries."))
      .add(make_option("cost_max", data->cost_max).default_value(1.f).help("cost upper bound. Default 1."))
      .add(make_option("cost_min", data->cost_min).default_value(0.f).help("cost lower bound. Default 0."))
      // TODO replace with trace and quiet
      .add(make_option("csa_debug", data->print_debug_stuff).help("print debug stuff for cs_active"));
  options.add_and_parse(new_options);

  data->use_domination = true;
  if (options.was_supplied("domination") && !domination)
    data->use_domination = false;

  if (!options.was_supplied("cs_active"))
    return nullptr;

  data->all = &all;
  data->t = 1;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "squared")
    THROW("error: you can't use non-squared loss with cs_active");

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --cs_active and --active at the same time");

  if (options.was_supplied("active_cover"))
    THROW("error: you can't use --cs_active and --active_cover at the same time");

  if (options.was_supplied("csoaa"))
    THROW("error: you can't use --cs_active and --csoaa at the same time");

  if (!options.was_supplied("adax"))
    all.trace_message << "WARNING: --cs_active should be used with --adax" << endl;

  all.p->lp = cs_label;  // assigning the label parser
  all.set_minmax(all.sd, data->cost_max);
  all.set_minmax(all.sd, data->cost_min);
  for (uint32_t i = 0; i < data->num_classes + 1; i++) data->examples_by_queries.push_back(0);

  learner<cs_active, example>& l = simulation
      ? init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>,
            predict_or_learn<false, true>, data->num_classes, prediction_type::multilabels)
      : init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, false>,
            predict_or_learn<false, false>, data->num_classes, prediction_type::multilabels);

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  base_learner* b = make_base(l);
  all.cost_sensitive = b;
  return b;
}